

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recall_tree.cc
# Opt level: O0

node_pred * recall_tree_ns::find_or_create(recall_tree *b,uint32_t cn,example *ec)

{
  node_pred *new_ele;
  node *pnVar1;
  node_pred **ppnVar2;
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  node_pred newls;
  node_pred *ls;
  v_array<recall_tree_ns::node_pred> *in_stack_ffffffffffffffd0;
  example *in_stack_ffffffffffffffe0;
  node_pred *pnVar3;
  undefined4 in_stack_fffffffffffffff0;
  
  new_ele = find((recall_tree *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                 (uint32_t)((ulong)in_RDX >> 0x20),in_stack_ffffffffffffffe0);
  pnVar3 = new_ele;
  pnVar1 = v_array<recall_tree_ns::node>::operator[]
                     ((v_array<recall_tree_ns::node> *)(in_RDI + 0x10),(ulong)in_ESI);
  ppnVar2 = v_array<recall_tree_ns::node_pred>::end(&pnVar1->preds);
  if (new_ele == *ppnVar2) {
    node_pred::node_pred((node_pred *)&stack0xffffffffffffffd0,*(uint32_t *)(in_RDX + 0x6828));
    v_array<recall_tree_ns::node>::operator[]
              ((v_array<recall_tree_ns::node> *)(in_RDI + 0x10),(ulong)in_ESI);
    v_array<recall_tree_ns::node_pred>::push_back(in_stack_ffffffffffffffd0,new_ele);
    pnVar1 = v_array<recall_tree_ns::node>::operator[]
                       ((v_array<recall_tree_ns::node> *)(in_RDI + 0x10),(ulong)in_ESI);
    ppnVar2 = v_array<recall_tree_ns::node_pred>::end(&pnVar1->preds);
    pnVar3 = *ppnVar2 + -1;
  }
  return pnVar3;
}

Assistant:

node_pred* find_or_create(recall_tree& b, uint32_t cn, example& ec)
{
  node_pred* ls = find(b, cn, ec);

  if (ls == b.nodes[cn].preds.end())
  {
    node_pred newls(ec.l.multi.label);
    b.nodes[cn].preds.push_back(newls);
    ls = b.nodes[cn].preds.end() - 1;
  }

  return ls;
}